

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_plugin.c
# Opt level: O1

mk_plugin * mk_plugin_lookup(char *shortname,mk_server *server)

{
  mk_list *pmVar1;
  int iVar2;
  mk_list *__mptr;
  
  pmVar1 = (server->plugins).next;
  while( true ) {
    if (pmVar1 == &server->plugins) {
      return (mk_plugin *)0x0;
    }
    iVar2 = strcmp((char *)pmVar1[-7].prev,shortname);
    if (iVar2 == 0) break;
    pmVar1 = pmVar1->next;
  }
  return (mk_plugin *)&pmVar1[-8].next;
}

Assistant:

struct mk_plugin *mk_plugin_lookup(char *shortname, struct mk_server *server)
{
    struct mk_list *head;
    struct mk_plugin *p = NULL;

    mk_list_foreach(head, &server->plugins) {
        p = mk_list_entry(head, struct mk_plugin, _head);
        if (strcmp(p->shortname, shortname) == 0){
            return p;
        }
    }

    return NULL;
}